

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.cpp
# Opt level: O0

SRes crnlib::LzmaDec_AllocateProbs2(CLzmaDec *p,CLzmaProps *propNew,ISzAlloc *alloc)

{
  uint uVar1;
  UInt16 *pUVar2;
  UInt32 numProbs;
  ISzAlloc *alloc_local;
  CLzmaProps *propNew_local;
  CLzmaDec *p_local;
  
  uVar1 = (0x300 << ((char)propNew->lc + (char)propNew->lp & 0x1fU)) + 0x736;
  if ((p->probs == (UInt16 *)0x0) || (uVar1 != p->numProbs)) {
    LzmaDec_FreeProbs(p,alloc);
    pUVar2 = (UInt16 *)(*alloc->Alloc)(alloc,(ulong)uVar1 << 1);
    p->probs = pUVar2;
    p->numProbs = uVar1;
    if (p->probs == (UInt16 *)0x0) {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SRes LzmaDec_AllocateProbs2(CLzmaDec* p, const CLzmaProps* propNew, ISzAlloc* alloc) {
  UInt32 numProbs = LzmaProps_GetNumProbs(propNew);
  if (p->probs == 0 || numProbs != p->numProbs) {
    LzmaDec_FreeProbs(p, alloc);
    p->probs = (CLzmaProb*)alloc->Alloc(alloc, numProbs * sizeof(CLzmaProb));
    p->numProbs = numProbs;
    if (p->probs == 0)
      return SZ_ERROR_MEM;
  }
  return SZ_OK;
}